

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O3

void __thiscall ot::commissioner::DtlsSession::InitMbedtls(DtlsSession *this)

{
  mbedtls_ssl_config_init(&this->mConfig);
  mbedtls_ssl_cookie_init(&this->mCookie);
  mbedtls_entropy_init(&this->mEntropy);
  mbedtls_ctr_drbg_init(&this->mCtrDrbg);
  mbedtls_ctr_drbg_seed(&this->mCtrDrbg,mbedtls_entropy_func,&this->mEntropy,(uchar *)0x0,0);
  mbedtls_ssl_init(&this->mSsl);
  mbedtls_x509_crt_init(&this->mCaChain);
  mbedtls_x509_crt_init(&this->mOwnCert);
  mbedtls_pk_init(&this->mOwnKey);
  return;
}

Assistant:

void DtlsSession::InitMbedtls()
{
    mbedtls_ssl_config_init(&mConfig);
    mbedtls_ssl_cookie_init(&mCookie);
    mbedtls_entropy_init(&mEntropy);
    mbedtls_ctr_drbg_init(&mCtrDrbg);
    mbedtls_ctr_drbg_seed(&mCtrDrbg, mbedtls_entropy_func, &mEntropy, nullptr, 0);
    mbedtls_ssl_init(&mSsl);

    mbedtls_x509_crt_init(&mCaChain);
    mbedtls_x509_crt_init(&mOwnCert);
    mbedtls_pk_init(&mOwnKey);
}